

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

QTableWidgetItem * __thiscall QTableModel::takeVerticalHeaderItem(QTableModel *this,int section)

{
  pointer ppQVar1;
  QTableWidgetItem *pQVar2;
  ulong uVar3;
  
  if (((section < 0) ||
      (uVar3 = (ulong)(uint)section, (ulong)(this->verticalHeaderItems).d.size <= uVar3)) ||
     (pQVar2 = (this->verticalHeaderItems).d.ptr[uVar3], pQVar2 == (QTableWidgetItem *)0x0)) {
    pQVar2 = (QTableWidgetItem *)0x0;
  }
  else {
    pQVar2->view = (QTableWidget *)0x0;
    pQVar2->d->headerItem = false;
    ppQVar1 = QList<QTableWidgetItem_*>::data(&this->verticalHeaderItems);
    ppQVar1[uVar3] = (QTableWidgetItem *)0x0;
  }
  return pQVar2;
}

Assistant:

QTableWidgetItem *QTableModel::takeVerticalHeaderItem(int section)
{
    if (section < 0 || section >= verticalHeaderItems.size())
        return nullptr;
    QTableWidgetItem *itm = verticalHeaderItems.at(section);
    if (itm) {
        itm->view = nullptr;
        itm->d->headerItem = false;
        verticalHeaderItems[section] = 0;
    }
    return itm;
}